

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts3Incrmerge(Fts3Table *p,int nMerge,int nMin)

{
  uint uVar1;
  int iVar2;
  int *__s;
  Fts3Table *p_00;
  int in_EDX;
  int in_ESI;
  Fts3Table *in_RDI;
  long in_FS_OFFSET;
  int nKey;
  char *zKey;
  int bEmpty;
  int nHint;
  int bUseHint;
  i64 nMod;
  int nAlloc;
  int bDirtyHint;
  sqlite3_int64 iAbsLevel;
  IncrmergeWriter *pWriter;
  Fts3SegFilter *pFilter;
  Fts3MultiSegReader *pCsr;
  int nRem;
  int bIgnore;
  int nHintSeg;
  sqlite3_int64 iHintAbsLevel;
  int iIdx;
  sqlite3_stmt *pFindLevel;
  Blob hint;
  int nSeg;
  int rc;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  int in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  Fts3Table *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  int iIdx_00;
  Fts3Table *in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  sqlite3_stmt *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  int in_stack_ffffffffffffff68;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  Fts3Table *pFVar6;
  Fts3Table *p_01;
  int *piVar7;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar8;
  int local_44;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  Fts3Table *in_stack_ffffffffffffffc8;
  undefined1 local_20 [8];
  int local_18;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = -0x55555556;
  local_10 = 0;
  pFVar6 = (Fts3Table *)0x0;
  iVar8 = in_ESI;
  memset(local_20,0,0x10);
  iVar5 = 0;
  uVar4 = 0x328;
  __s = (int *)sqlite3_malloc64(CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  if (__s == (int *)0x0) {
    local_44 = 7;
  }
  else {
    p_01 = (Fts3Table *)(__s + 0xae);
    piVar7 = __s + 0xb4;
    local_c = fts3IncrmergeHintLoad
                        (in_stack_ffffffffffffff48,
                         (Blob *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    while( true ) {
      uVar1 = in_stack_ffffffffffffff50 & 0xffffff;
      if (local_c == 0) {
        uVar1 = CONCAT13(0 < in_ESI,(int3)in_stack_ffffffffffffff50);
      }
      in_stack_ffffffffffffff50 = uVar1;
      if ((char)(in_stack_ffffffffffffff50 >> 0x18) == '\0') goto LAB_00258d0e;
      p_00 = (Fts3Table *)(long)(in_RDI->nIndex << 10);
      uVar3 = 0;
      local_c = fts3SqlStmt((Fts3Table *)
                            CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                            (int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                            (sqlite3_stmt **)
                            CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                            (sqlite3_value **)in_stack_ffffffffffffff48);
      in_stack_ffffffffffffff48 = (Fts3Table *)0x0;
      iIdx_00 = in_EDX;
      if (in_EDX < 2) {
        iIdx_00 = 2;
      }
      sqlite3_bind_int((sqlite3_stmt *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30)
                       ,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
      iVar2 = sqlite3_step(in_stack_ffffffffffffff58);
      if (iVar2 == 100) {
        pFVar6 = (Fts3Table *)
                 sqlite3_column_int64
                           ((sqlite3_stmt *)
                            CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                            in_stack_ffffffffffffff2c);
        local_10 = sqlite3_column_int((sqlite3_stmt *)
                                      CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                                      in_stack_ffffffffffffff2c);
      }
      else {
        local_10 = -1;
      }
      local_c = sqlite3_reset((sqlite3_stmt *)CONCAT44(iIdx_00,in_stack_ffffffffffffff40));
      iVar2 = local_18;
      if ((local_c == 0) && (local_18 != 0)) {
        in_stack_ffffffffffffffc8 = (Fts3Table *)0x0;
        in_stack_ffffffffffffffc4 = 0;
        in_stack_ffffffffffffff68 = local_18;
        local_c = fts3IncrmergeHintPop
                            ((Blob *)in_stack_ffffffffffffff48,
                             (i64 *)CONCAT44(iIdx_00,in_stack_ffffffffffffff40),
                             (int *)in_stack_ffffffffffffff38);
        if ((local_10 < 0) ||
           (in_stack_ffffffffffffff38 = (Fts3Table *)((long)pFVar6 % (long)p_00),
           iVar2 = in_stack_ffffffffffffff68,
           (long)in_stack_ffffffffffffffc8 % (long)p_00 <= (long)in_stack_ffffffffffffff38)) {
          in_stack_ffffffffffffff34 = local_10;
          if (local_10 < in_EDX) {
            in_stack_ffffffffffffff34 = in_EDX;
          }
          in_stack_ffffffffffffff2c = in_stack_ffffffffffffffc4;
          if ((in_stack_ffffffffffffff34 < in_stack_ffffffffffffffc4) &&
             (in_stack_ffffffffffffff2c = local_10, in_stack_ffffffffffffff30 = local_10,
             local_10 < in_EDX)) {
            in_stack_ffffffffffffff2c = in_EDX;
            in_stack_ffffffffffffff30 = in_EDX;
          }
          uVar3 = 1;
          iVar5 = 1;
          pFVar6 = in_stack_ffffffffffffffc8;
          iVar2 = local_18;
          local_10 = in_stack_ffffffffffffff2c;
        }
      }
      local_18 = iVar2;
      if (local_10 < 1) goto LAB_00258d0e;
      if (((long)pFVar6 < 0) || ((long)p_00 << 0x20 < (long)pFVar6)) break;
      memset(__s,0,0x328);
      *(undefined4 *)&(p_01->base).zErrMsg = 1;
      if (local_c == 0) {
        local_c = fts3IncrmergeOutputIdx
                            ((Fts3Table *)CONCAT44(iIdx_00,in_stack_ffffffffffffff40),
                             (sqlite3_int64)in_stack_ffffffffffffff38,
                             (int *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
        in_stack_ffffffffffffffc0 = 0;
        local_c = fts3SegmentIsMaxLevel
                            (in_stack_ffffffffffffff38,
                             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                             (int *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
        if (in_stack_ffffffffffffffc0 != 0) {
          *(uint *)&(p_01->base).zErrMsg = *(uint *)&(p_01->base).zErrMsg | 2;
        }
      }
      if (local_c == 0) {
        local_c = fts3IncrmergeCsr(p_01,(sqlite3_int64)__s,(int)((ulong)pFVar6 >> 0x20),
                                   (Fts3MultiSegReader *)CONCAT44(iVar5,uVar4));
      }
      if (((local_c == 0) && (piVar7[2] == local_10)) &&
         (local_c = sqlite3Fts3SegReaderStart
                              ((Fts3Table *)
                               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                               (Fts3MultiSegReader *)
                               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                               (Fts3SegFilter *)0x258a90), local_c == 0)) {
        in_stack_ffffffffffffff64 = 0;
        local_c = sqlite3Fts3SegReaderStep
                            (in_stack_ffffffffffffffc8,
                             (Fts3MultiSegReader *)
                             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
        if (local_c == 0) {
          in_stack_ffffffffffffff64 = 1;
        }
        else if (local_c != 100) {
          sqlite3Fts3SegReaderFinish
                    ((Fts3MultiSegReader *)
                     CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
          goto LAB_00258d0e;
        }
        local_c = fts3IncrmergeWriter((Fts3Table *)
                                      CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                                      (sqlite3_int64)in_stack_ffffffffffffff48,iIdx_00,
                                      (Fts3MultiSegReader *)in_stack_ffffffffffffff38,
                                      (IncrmergeWriter *)
                                      CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30))
        ;
        if ((local_c == 0) && (*__s != 0)) {
          if (in_stack_ffffffffffffff64 == 0) {
            local_c = 0;
            do {
              local_c = fts3IncrmergeAppend(p_00,(IncrmergeWriter *)
                                                 CONCAT44(uVar3,in_stack_ffffffffffffff68),
                                            (Fts3MultiSegReader *)
                                            CONCAT44(in_stack_ffffffffffffff64,
                                                     in_stack_ffffffffffffff60));
              if (local_c == 0) {
                local_c = sqlite3Fts3SegReaderStep
                                    (in_stack_ffffffffffffffc8,
                                     (Fts3MultiSegReader *)
                                     CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
              }
              if ((in_ESI <= __s[1]) && (local_c == 100)) {
                local_c = 0;
              }
            } while (local_c == 100);
          }
          if (local_c == 0) {
            in_ESI = in_ESI - (__s[1] + 1);
            local_c = fts3IncrmergeChomp(p_00,CONCAT44(uVar3,in_stack_ffffffffffffff68),
                                         (Fts3MultiSegReader *)
                                         CONCAT44(in_stack_ffffffffffffff64,
                                                  in_stack_ffffffffffffff60),
                                         (int *)in_stack_ffffffffffffff58);
            if (local_10 != 0) {
              iVar5 = 1;
              fts3IncrmergeHintPush
                        ((Blob *)CONCAT44(iIdx_00,in_stack_ffffffffffffff40),
                         (i64)in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,
                         (int *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
            }
          }
        }
        if (local_10 != 0) {
          *(long *)(__s + 10) = -*(long *)(__s + 10);
        }
        fts3IncrmergeRelease
                  (in_RDI,(IncrmergeWriter *)CONCAT44(iVar8,in_EDX),
                   (int *)CONCAT44(in_ESI,in_stack_ffffffffffffffa0));
        if ((local_10 == 0) && ((char)__s[0xc] == '\0')) {
          fts3PromoteSegments(p_00,CONCAT44(uVar3,in_stack_ffffffffffffff68),
                              CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
        }
      }
      sqlite3Fts3SegReaderFinish
                ((Fts3MultiSegReader *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30)
                );
    }
    local_c = 0x10b;
LAB_00258d0e:
    if ((iVar5 != 0) && (local_c == 0)) {
      local_c = fts3IncrmergeHintStore
                          ((Fts3Table *)
                           CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                           (Blob *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    }
    sqlite3_free((void *)0x258d45);
    sqlite3_free((void *)0x258d52);
    local_44 = local_c;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_44;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3Incrmerge(Fts3Table *p, int nMerge, int nMin){
  int rc;                         /* Return code */
  int nRem = nMerge;              /* Number of leaf pages yet to  be written */
  Fts3MultiSegReader *pCsr;       /* Cursor used to read input data */
  Fts3SegFilter *pFilter;         /* Filter used with cursor pCsr */
  IncrmergeWriter *pWriter;       /* Writer object */
  int nSeg = 0;                   /* Number of input segments */
  sqlite3_int64 iAbsLevel = 0;    /* Absolute level number to work on */
  Blob hint = {0, 0, 0};          /* Hint read from %_stat table */
  int bDirtyHint = 0;             /* True if blob 'hint' has been modified */

  /* Allocate space for the cursor, filter and writer objects */
  const int nAlloc = sizeof(*pCsr) + sizeof(*pFilter) + sizeof(*pWriter);
  pWriter = (IncrmergeWriter *)sqlite3_malloc64(nAlloc);
  if( !pWriter ) return SQLITE_NOMEM;
  pFilter = (Fts3SegFilter *)&pWriter[1];
  pCsr = (Fts3MultiSegReader *)&pFilter[1];

  rc = fts3IncrmergeHintLoad(p, &hint);
  while( rc==SQLITE_OK && nRem>0 ){
    const i64 nMod = FTS3_SEGDIR_MAXLEVEL * p->nIndex;
    sqlite3_stmt *pFindLevel = 0; /* SQL used to determine iAbsLevel */
    int bUseHint = 0;             /* True if attempting to append */
    int iIdx = 0;                 /* Largest idx in level (iAbsLevel+1) */

    /* Search the %_segdir table for the absolute level with the smallest
    ** relative level number that contains at least nMin segments, if any.
    ** If one is found, set iAbsLevel to the absolute level number and
    ** nSeg to nMin. If no level with at least nMin segments can be found,
    ** set nSeg to -1.
    */
    rc = fts3SqlStmt(p, SQL_FIND_MERGE_LEVEL, &pFindLevel, 0);
    sqlite3_bind_int(pFindLevel, 1, MAX(2, nMin));
    if( sqlite3_step(pFindLevel)==SQLITE_ROW ){
      iAbsLevel = sqlite3_column_int64(pFindLevel, 0);
      nSeg = sqlite3_column_int(pFindLevel, 1);
      assert( nSeg>=2 );
    }else{
      nSeg = -1;
    }
    rc = sqlite3_reset(pFindLevel);

    /* If the hint read from the %_stat table is not empty, check if the
    ** last entry in it specifies a relative level smaller than or equal
    ** to the level identified by the block above (if any). If so, this
    ** iteration of the loop will work on merging at the hinted level.
    */
    if( rc==SQLITE_OK && hint.n ){
      int nHint = hint.n;
      sqlite3_int64 iHintAbsLevel = 0;      /* Hint level */
      int nHintSeg = 0;                     /* Hint number of segments */

      rc = fts3IncrmergeHintPop(&hint, &iHintAbsLevel, &nHintSeg);
      if( nSeg<0 || (iAbsLevel % nMod) >= (iHintAbsLevel % nMod) ){
        /* Based on the scan in the block above, it is known that there
        ** are no levels with a relative level smaller than that of
        ** iAbsLevel with more than nSeg segments, or if nSeg is -1,
        ** no levels with more than nMin segments. Use this to limit the
        ** value of nHintSeg to avoid a large memory allocation in case the
        ** merge-hint is corrupt*/
        iAbsLevel = iHintAbsLevel;
        nSeg = MIN(MAX(nMin,nSeg), nHintSeg);
        bUseHint = 1;
        bDirtyHint = 1;
      }else{
        /* This undoes the effect of the HintPop() above - so that no entry
        ** is removed from the hint blob.  */
        hint.n = nHint;
      }
    }

    /* If nSeg is less that zero, then there is no level with at least
    ** nMin segments and no hint in the %_stat table. No work to do.
    ** Exit early in this case.  */
    if( nSeg<=0 ) break;

    assert( nMod<=0x7FFFFFFF );
    if( iAbsLevel<0 || iAbsLevel>(nMod<<32) ){
      rc = FTS_CORRUPT_VTAB;
      break;
    }

    /* Open a cursor to iterate through the contents of the oldest nSeg
    ** indexes of absolute level iAbsLevel. If this cursor is opened using
    ** the 'hint' parameters, it is possible that there are less than nSeg
    ** segments available in level iAbsLevel. In this case, no work is
    ** done on iAbsLevel - fall through to the next iteration of the loop
    ** to start work on some other level.  */
    memset(pWriter, 0, nAlloc);
    pFilter->flags = FTS3_SEGMENT_REQUIRE_POS;

    if( rc==SQLITE_OK ){
      rc = fts3IncrmergeOutputIdx(p, iAbsLevel, &iIdx);
      assert( bUseHint==1 || bUseHint==0 );
      if( iIdx==0 || (bUseHint && iIdx==1) ){
        int bIgnore = 0;
        rc = fts3SegmentIsMaxLevel(p, iAbsLevel+1, &bIgnore);
        if( bIgnore ){
          pFilter->flags |= FTS3_SEGMENT_IGNORE_EMPTY;
        }
      }
    }

    if( rc==SQLITE_OK ){
      rc = fts3IncrmergeCsr(p, iAbsLevel, nSeg, pCsr);
    }
    if( SQLITE_OK==rc && pCsr->nSegment==nSeg
     && SQLITE_OK==(rc = sqlite3Fts3SegReaderStart(p, pCsr, pFilter))
    ){
      int bEmpty = 0;
      rc = sqlite3Fts3SegReaderStep(p, pCsr);
      if( rc==SQLITE_OK ){
        bEmpty = 1;
      }else if( rc!=SQLITE_ROW ){
        sqlite3Fts3SegReaderFinish(pCsr);
        break;
      }
      if( bUseHint && iIdx>0 ){
        const char *zKey = pCsr->zTerm;
        int nKey = pCsr->nTerm;
        rc = fts3IncrmergeLoad(p, iAbsLevel, iIdx-1, zKey, nKey, pWriter);
      }else{
        rc = fts3IncrmergeWriter(p, iAbsLevel, iIdx, pCsr, pWriter);
      }

      if( rc==SQLITE_OK && pWriter->nLeafEst ){
        fts3LogMerge(nSeg, iAbsLevel);
        if( bEmpty==0 ){
          do {
            rc = fts3IncrmergeAppend(p, pWriter, pCsr);
            if( rc==SQLITE_OK ) rc = sqlite3Fts3SegReaderStep(p, pCsr);
            if( pWriter->nWork>=nRem && rc==SQLITE_ROW ) rc = SQLITE_OK;
          }while( rc==SQLITE_ROW );
        }

        /* Update or delete the input segments */
        if( rc==SQLITE_OK ){
          nRem -= (1 + pWriter->nWork);
          rc = fts3IncrmergeChomp(p, iAbsLevel, pCsr, &nSeg);
          if( nSeg!=0 ){
            bDirtyHint = 1;
            fts3IncrmergeHintPush(&hint, iAbsLevel, nSeg, &rc);
          }
        }
      }

      if( nSeg!=0 ){
        pWriter->nLeafData = pWriter->nLeafData * -1;
      }
      fts3IncrmergeRelease(p, pWriter, &rc);
      if( nSeg==0 && pWriter->bNoLeafData==0 ){
        fts3PromoteSegments(p, iAbsLevel+1, pWriter->nLeafData);
      }
    }

    sqlite3Fts3SegReaderFinish(pCsr);
  }

  /* Write the hint values into the %_stat table for the next incr-merger */
  if( bDirtyHint && rc==SQLITE_OK ){
    rc = fts3IncrmergeHintStore(p, &hint);
  }

  sqlite3_free(pWriter);
  sqlite3_free(hint.a);
  return rc;
}